

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O0

err_t bign96PubkeyVal(bign_params *params,octet *pubkey)

{
  bool_t bVar1;
  ec_o *stack_00;
  word *pwVar2;
  octet *in_RSI;
  bign_params *in_RDI;
  void *stack;
  word *Q;
  ec_o *ec;
  void *state;
  size_t n;
  err_t code;
  size_t in_stack_ffffffffffffffb8;
  word *pwVar3;
  ec_o *ec_00;
  word *a;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar4;
  
  bVar1 = memIsValid(in_RDI,0x150);
  if (bVar1 == 0) {
    eVar4 = 0x6d;
  }
  else if (in_RDI->l == 0x60) {
    bign96Start_keep((bign96_deep_i)stack);
    stack_00 = (ec_o *)blobCreate(in_stack_ffffffffffffffb8);
    if (stack_00 == (ec_o *)0x0) {
      eVar4 = 0x6e;
    }
    else {
      eVar4 = bign96Start((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          in_RDI);
      if (eVar4 == 0) {
        a = (word *)stack_00->f->n;
        ec_00 = stack_00;
        bVar1 = memIsValid(in_RSI,0x30);
        if (bVar1 == 0) {
          blobClose((blob_t)0x154840);
          eVar4 = 0x6d;
        }
        else {
          pwVar2 = (word *)((long)&(stack_00->hdr).keep + (stack_00->hdr).keep);
          pwVar3 = pwVar2 + (long)a * 2;
          bVar1 = (*stack_00->f->from)(pwVar2,in_RSI,stack_00->f,pwVar3);
          if ((bVar1 != 0) &&
             (bVar1 = (*stack_00->f->from)(pwVar2 + (long)a,in_RSI + 0x18,stack_00->f,pwVar3),
             bVar1 != 0)) {
            bVar1 = ecpIsOnA(a,ec_00,stack_00);
            eVar4 = 0x1f9;
            if (bVar1 != 0) {
              eVar4 = 0;
            }
            blobClose((blob_t)0x154921);
            return eVar4;
          }
          blobClose((blob_t)0x1548e7);
          eVar4 = 0x1f9;
        }
      }
      else {
        blobClose((blob_t)0x1547f9);
      }
    }
  }
  else {
    eVar4 = 0x1f6;
  }
  return eVar4;
}

Assistant:

err_t bign96PubkeyVal(const bign_params* params, const octet pubkey[48])
{
	err_t code;
	size_t n;
	// состояние
	void* state;
	ec_o* ec;			/* описание эллиптической кривой */
	word* Q;			/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96PubkeyVal_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(pubkey, 48))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	Q = objEnd(ec, word);
	stack = Q + 2 * n;
	// загрузить pt
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, n), pubkey + 24, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// Q \in ec?
	code = ecpIsOnA(Q, ec, stack) ? ERR_OK : ERR_BAD_PUBKEY;
	// завершение
	blobClose(state);
	return code;
}